

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O2

int ssl_use_certificate(CERT *cert,X509 *x)

{
  bool bVar1;
  uint uVar2;
  UniquePtr<CRYPTO_BUFFER> buffer;
  UniquePtr<CRYPTO_BUFFER> local_18;
  
  if (x == (X509 *)0x0) {
    uVar2 = 0;
    ERR_put_error(0x10,0,0x43,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                  ,0x238);
  }
  else {
    bssl::x509_to_buffer((bssl *)&buffer,x);
    if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
        buffer._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
      uVar2 = 0;
    }
    else {
      local_18 = (UniquePtr<CRYPTO_BUFFER>)
                 (UniquePtr<CRYPTO_BUFFER>)
                 buffer._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
      buffer._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0;
      bVar1 = bssl::ssl_set_cert(cert,&local_18);
      uVar2 = (uint)bVar1;
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_18);
    }
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&buffer);
  }
  return uVar2;
}

Assistant:

static int ssl_use_certificate(CERT *cert, X509 *x) {
  if (x == NULL) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_PASSED_NULL_PARAMETER);
    return 0;
  }

  UniquePtr<CRYPTO_BUFFER> buffer = x509_to_buffer(x);
  if (!buffer) {
    return 0;
  }

  return ssl_set_cert(cert, std::move(buffer));
}